

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O1

int Cudd_zddDumpDot(DdManager *dd,int n,DdNode **f,char **inames,char **onames,FILE *fp)

{
  int *piVar1;
  FILE *__stream;
  int iVar2;
  void *__s;
  DdNode *pDVar3;
  st__table *visited;
  st__generator *gen;
  ulong uVar4;
  undefined4 in_register_00000034;
  char *__format;
  uint uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  DdNode **ppDVar10;
  bool bVar11;
  DdNode *local_88;
  DdManager *local_80;
  st__table *local_78;
  ulong local_70;
  DdNode **local_68;
  long local_60;
  DdNode **local_58;
  DdNode **local_50;
  FILE *local_48;
  char **local_40;
  long local_38;
  
  local_70 = CONCAT44(in_register_00000034,n);
  iVar2 = dd->sizeZ;
  lVar8 = (long)iVar2;
  local_68 = f;
  local_50 = (DdNode **)inames;
  __s = malloc(lVar8 * 4);
  if (__s == (void *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    local_60 = lVar8;
    local_40 = onames;
    if (0 < iVar2) {
      memset(__s,0,lVar8 * 4);
    }
    if (0 < (int)local_70) {
      uVar4 = local_70 & 0xffffffff;
      uVar9 = 0;
      do {
        pDVar3 = Cudd_Support(dd,local_68[uVar9]);
        visited = (st__table *)0x0;
        if (pDVar3 == (DdNode *)0x0) goto LAB_007f9aed;
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        uVar5 = pDVar3->index;
        local_88 = pDVar3;
        while (uVar5 != 0x7fffffff) {
          *(undefined4 *)((long)__s + (ulong)uVar5 * 4) = 1;
          local_88 = (local_88->type).kids.T;
          uVar5 = local_88->index;
        }
        Cudd_RecursiveDeref(dd,pDVar3);
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar4);
    }
    visited = st__init_table(st__ptrcmp,st__ptrhash);
    if (visited != (st__table *)0x0) {
      if (0 < (int)local_70) {
        uVar4 = local_70 & 0xffffffff;
        uVar9 = 0;
        do {
          iVar2 = cuddCollectNodes(local_68[uVar9],visited);
          if (iVar2 == 0) goto LAB_007f9aed;
          uVar9 = uVar9 + 1;
        } while (uVar4 != uVar9);
      }
      pDVar3 = *local_68;
      local_80 = dd;
      local_78 = visited;
      local_48 = (FILE *)fp;
      gen = st__init_gen(visited);
      iVar2 = st__gen(gen,(char **)&local_88,(char **)0x0);
      uVar4 = 0;
      if (iVar2 != 0) {
        uVar4 = 0;
        do {
          uVar4 = uVar4 | (ulong)local_88 ^ (ulong)pDVar3;
          iVar2 = st__gen(gen,(char **)&local_88,(char **)0x0);
        } while (iVar2 != 0);
      }
      st__free_gen(gen);
      __stream = local_48;
      uVar5 = 0;
      do {
        uVar7 = ~(-1 << ((byte)uVar5 & 0x1f));
        if ((long)uVar4 <= (long)(ulong)uVar7) break;
        bVar11 = uVar5 < 0x3c;
        uVar5 = uVar5 + 4;
      } while (bVar11);
      iVar2 = fprintf(local_48,"digraph \"ZDD\" {\n");
      if (iVar2 == -1) {
        return 0;
      }
      iVar2 = fprintf(__stream,"size = \"7.5,10\"\ncenter = true;\nedge [dir = none];\n");
      if (iVar2 == -1) {
        return 0;
      }
      iVar2 = fprintf(__stream,"{ node [shape = plaintext];\n");
      visited = local_78;
      if (((iVar2 != -1) &&
          (iVar2 = fprintf(__stream,"  edge [style = invis];\n"), visited = local_78, iVar2 != -1))
         && (iVar2 = fprintf(__stream,"  \"CONST NODES\" [style = invis];\n"), iVar2 != -1)) {
        if (0 < (int)local_60) {
          lVar8 = 0;
          do {
            if (*(int *)((long)__s + (long)local_80->invpermZ[lVar8] * 4) != 0) {
              if (local_50 == (DdNode **)0x0) {
                iVar2 = fprintf(__stream,"\" %d \" -> ");
              }
              else {
                iVar2 = fprintf(__stream,"\" %s \" -> ",local_50[local_80->invpermZ[lVar8]]);
              }
              if (iVar2 == -1) goto LAB_007f9aed;
            }
            lVar8 = lVar8 + 1;
          } while (local_60 != lVar8);
        }
        iVar2 = fprintf(__stream,"\"CONST NODES\"; \n}\n");
        if ((iVar2 != -1) &&
           (iVar2 = fprintf(__stream,"{ rank = same; node [shape = box]; edge [style = invis];\n"),
           iVar2 != -1)) {
          if (0 < (int)local_70) {
            uVar5 = (int)local_70 - 1;
            local_58 = (DdNode **)(local_70 & 0xffffffff);
            ppDVar10 = (DdNode **)0x0;
            do {
              if (local_40 == (char **)0x0) {
                iVar2 = fprintf(__stream,"\"F%d\"",(ulong)ppDVar10 & 0xffffffff);
              }
              else {
                iVar2 = fprintf(__stream,"\"  %s  \"",local_40[(long)ppDVar10]);
              }
              if (iVar2 == -1) goto LAB_007f9aed;
              __format = " -> ";
              if ((DdNode **)(ulong)uVar5 == ppDVar10) {
                __format = "; }\n";
              }
              iVar2 = fprintf(__stream,__format);
              if (iVar2 == -1) goto LAB_007f9aed;
              ppDVar10 = (DdNode **)((long)ppDVar10 + 1);
            } while (local_58 != ppDVar10);
          }
          if (0 < (int)local_60) {
            lVar6 = 0;
            lVar8 = local_60;
            do {
              if (*(int *)((long)__s + (long)local_80->invpermZ[lVar6] * 4) != 0) {
                iVar2 = fprintf(__stream,"{ rank = same; ");
                if (iVar2 == -1) goto LAB_007f9aed;
                if (local_50 == (DdNode **)0x0) {
                  iVar2 = fprintf(__stream,"\" %d \";\n");
                }
                else {
                  iVar2 = fprintf(__stream,"\" %s \";\n",local_50[local_80->invpermZ[lVar6]]);
                }
                if (iVar2 == -1) goto LAB_007f9aed;
                local_38 = (long)(int)local_80->subtableZ[lVar6].slots;
                if (0 < local_38) {
                  local_58 = local_80->subtableZ[lVar6].nodelist;
                  lVar8 = 0;
                  do {
                    for (local_88 = local_58[lVar8]; local_88 != (DdNode *)0x0;
                        local_88 = local_88->next) {
                      iVar2 = st__lookup(visited,(char *)local_88,(char **)0x0);
                      if (iVar2 != 0) {
                        iVar2 = fprintf(__stream,"\"%p\";\n",(ulong)((uint)local_88 & uVar7) / 0x28)
                        ;
                        if (iVar2 == -1) goto LAB_007f9aed;
                      }
                    }
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != local_38);
                }
                iVar2 = fprintf(__stream,"}\n");
                lVar8 = local_60;
                if (iVar2 == -1) goto LAB_007f9aed;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 != lVar8);
          }
          iVar2 = fprintf(__stream,"{ rank = same; \"CONST NODES\";\n{ node [shape = box]; ");
          if (iVar2 != -1) {
            local_58 = (DdNode **)(long)(int)(local_80->constants).slots;
            if (0 < (long)local_58) {
              local_50 = (local_80->constants).nodelist;
              ppDVar10 = (DdNode **)0x0;
              do {
                for (local_88 = local_50[(long)ppDVar10]; local_88 != (DdNode *)0x0;
                    local_88 = local_88->next) {
                  iVar2 = st__lookup(visited,(char *)local_88,(char **)0x0);
                  if (iVar2 != 0) {
                    iVar2 = fprintf(__stream,"\"%p\";\n",(ulong)((uint)local_88 & uVar7) / 0x28);
                    if (iVar2 == -1) goto LAB_007f9aed;
                  }
                }
                ppDVar10 = (DdNode **)((long)ppDVar10 + 1);
              } while (ppDVar10 != local_58);
            }
            iVar2 = fprintf(__stream,"}\n}\n");
            if (iVar2 != -1) {
              if (0 < (int)local_70) {
                uVar4 = local_70 & 0xffffffff;
                uVar9 = 0;
                do {
                  if (local_40 == (char **)0x0) {
                    iVar2 = fprintf(__stream,"\"F%d\"",uVar9 & 0xffffffff);
                  }
                  else {
                    iVar2 = fprintf(__stream,"\"  %s  \"",local_40[uVar9]);
                  }
                  if ((iVar2 == -1) ||
                     (iVar2 = fprintf(__stream," -> \"%p\" [style = solid];\n",
                                      (ulong)(*(uint *)(local_68 + uVar9) & uVar7) / 0x28),
                     iVar2 == -1)) goto LAB_007f9aed;
                  uVar9 = uVar9 + 1;
                } while (uVar4 != uVar9);
              }
              if (0 < (int)local_60) {
                lVar8 = 0;
                do {
                  if (*(int *)((long)__s + (long)local_80->invpermZ[lVar8] * 4) != 0) {
                    local_70 = (ulong)(int)local_80->subtableZ[lVar8].slots;
                    if (0 < (long)local_70) {
                      local_68 = local_80->subtableZ[lVar8].nodelist;
                      uVar4 = 0;
                      do {
                        for (local_88 = local_68[uVar4]; local_88 != (DdNode *)0x0;
                            local_88 = local_88->next) {
                          iVar2 = st__lookup(local_78,(char *)local_88,(char **)0x0);
                          if ((iVar2 != 0) &&
                             ((iVar2 = fprintf(__stream,"\"%p\" -> \"%p\";\n",
                                               (ulong)((uint)local_88 & uVar7) / 0x28,
                                               (ulong)(*(uint *)&local_88->type & uVar7) / 0x28),
                              visited = local_78, iVar2 == -1 ||
                              (iVar2 = fprintf(__stream,"\"%p\" -> \"%p\" [style = dashed];\n",
                                               (ulong)((uint)local_88 & uVar7) / 0x28,
                                               (ulong)(*(uint *)((long)&local_88->type + 8) & uVar7)
                                               / 0x28), visited = local_78, iVar2 == -1))))
                          goto LAB_007f9aed;
                        }
                        uVar4 = uVar4 + 1;
                      } while (uVar4 != local_70);
                    }
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 != local_60);
              }
              lVar8 = (long)(int)(local_80->constants).slots;
              if (0 < lVar8) {
                local_68 = (local_80->constants).nodelist;
                lVar6 = 0;
                do {
                  for (local_88 = local_68[lVar6]; local_88 != (DdNode *)0x0;
                      local_88 = local_88->next) {
                    iVar2 = st__lookup(local_78,(char *)local_88,(char **)0x0);
                    if ((iVar2 != 0) &&
                       (iVar2 = fprintf(local_48,"\"%p\" [label = \"%g\"];\n",(local_88->type).value
                                        ,(ulong)((uint)local_88 & uVar7) / 0x28), visited = local_78
                       , iVar2 == -1)) goto LAB_007f9aed;
                  }
                  lVar6 = lVar6 + 1;
                } while (lVar6 != lVar8);
              }
              iVar2 = fprintf(local_48,"}\n");
              visited = local_78;
              if (iVar2 != -1) {
                st__free_table(local_78);
                free(__s);
                return 1;
              }
            }
          }
        }
      }
      goto LAB_007f9aed;
    }
  }
  visited = (st__table *)0x0;
LAB_007f9aed:
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (visited != (st__table *)0x0) {
    st__free_table(visited);
  }
  return 0;
}

Assistant:

int
Cudd_zddDumpDot(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  FILE * fp /* pointer to the dump file */)
{
    DdNode      *support = NULL;
    DdNode      *scan;
    int         *sorted = NULL;
    int         nvars = dd->sizeZ;
    st__table    *visited = NULL;
    st__generator *gen;
    int         retval;
    int         i, j;
    int         slots;
    DdNodePtr   *nodelist;
    long        refAddr, diff, mask;

    /* Build a bit array with the support of f. */
    sorted = ABC_ALLOC(int,nvars);
    if (sorted == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        goto failure;
    }
    for (i = 0; i < nvars; i++) sorted[i] = 0;

    /* Take the union of the supports of each output function. */
    for (i = 0; i < n; i++) {
        support = Cudd_Support(dd,f[i]);
        if (support == NULL) goto failure;
        cuddRef(support);
        scan = support;
        while (!cuddIsConstant(scan)) {
            sorted[scan->index] = 1;
            scan = cuddT(scan);
        }
        Cudd_RecursiveDeref(dd,support);
    }
    support = NULL; /* so that we do not try to free it in case of failure */

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    /* Collect all the nodes of this DD in the symbol table. */
    for (i = 0; i < n; i++) {
        retval = cuddCollectNodes(f[i],visited);
        if (retval == 0) goto failure;
    }

    /* Find how many most significant hex digits are identical
    ** in the addresses of all the nodes. Build a mask based
    ** on this knowledge, so that digits that carry no information
    ** will not be printed. This is done in two steps.
    **  1. We scan the symbol table to find the bits that differ
    **     in at least 2 addresses.
    **  2. We choose one of the possible masks. There are 8 possible
    **     masks for 32-bit integer, and 16 possible masks for 64-bit
    **     integers.
    */

    /* Find the bits that are different. */
    refAddr = (long) f[0];
    diff = 0;
    gen = st__init_gen(visited);
    while ( st__gen(gen, (const char **)&scan, NULL)) {
        diff |= refAddr ^ (long) scan;
    }
    st__free_gen(gen);

    /* Choose the mask. */
    for (i = 0; (unsigned) i < 8 * sizeof(long); i += 4) {
        mask = (1 << i) - 1;
        if (diff <= mask) break;
    }

    /* Write the header and the global attributes. */
    retval = fprintf(fp,"digraph \"ZDD\" {\n");
    if (retval == EOF) return(0);
    retval = fprintf(fp,
        "size = \"7.5,10\"\ncenter = true;\nedge [dir = none];\n");
    if (retval == EOF) return(0);

    /* Write the input name subgraph by scanning the support array. */
    retval = fprintf(fp,"{ node [shape = plaintext];\n");
    if (retval == EOF) goto failure;
    retval = fprintf(fp,"  edge [style = invis];\n");
    if (retval == EOF) goto failure;
    /* We use a name ("CONST NODES") with an embedded blank, because
    ** it is unlikely to appear as an input name.
    */
    retval = fprintf(fp,"  \"CONST NODES\" [style = invis];\n");
    if (retval == EOF) goto failure;
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invpermZ[i]]) {
            if (inames == NULL) {
                retval = fprintf(fp,"\" %d \" -> ", dd->invpermZ[i]);
            } else {
                retval = fprintf(fp,"\" %s \" -> ", inames[dd->invpermZ[i]]);
            }
            if (retval == EOF) goto failure;
        }
    }
    retval = fprintf(fp,"\"CONST NODES\"; \n}\n");
    if (retval == EOF) goto failure;

    /* Write the output node subgraph. */
    retval = fprintf(fp,"{ rank = same; node [shape = box]; edge [style = invis];\n");
    if (retval == EOF) goto failure;
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp,"\"F%d\"", i);
        } else {
            retval = fprintf(fp,"\"  %s  \"", onames[i]);
        }
        if (retval == EOF) goto failure;
        if (i == n - 1) {
            retval = fprintf(fp,"; }\n");
        } else {
            retval = fprintf(fp," -> ");
        }
        if (retval == EOF) goto failure;
    }

    /* Write rank info: All nodes with the same index have the same rank. */
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invpermZ[i]]) {
            retval = fprintf(fp,"{ rank = same; ");
            if (retval == EOF) goto failure;
            if (inames == NULL) {
                retval = fprintf(fp,"\" %d \";\n", dd->invpermZ[i]);
            } else {
                retval = fprintf(fp,"\" %s \";\n", inames[dd->invpermZ[i]]);
            }
            if (retval == EOF) goto failure;
            nodelist = dd->subtableZ[i].nodelist;
            slots = dd->subtableZ[i].slots;
            for (j = 0; j < slots; j++) {
                scan = nodelist[j];
                while (scan != NULL) {
                    if ( st__is_member(visited,(char *) scan)) {
                        retval = fprintf(fp,"\"%p\";\n", (void *)
                                         ((mask & (ptrint) scan) /
                                          sizeof(DdNode)));
                        if (retval == EOF) goto failure;
                    }
                    scan = scan->next;
                }
            }
            retval = fprintf(fp,"}\n");
            if (retval == EOF) goto failure;
        }
    }

    /* All constants have the same rank. */
    retval = fprintf(fp,
        "{ rank = same; \"CONST NODES\";\n{ node [shape = box]; ");
    if (retval == EOF) goto failure;
    nodelist = dd->constants.nodelist;
    slots = dd->constants.slots;
    for (j = 0; j < slots; j++) {
        scan = nodelist[j];
        while (scan != NULL) {
            if ( st__is_member(visited,(char *) scan)) {
                retval = fprintf(fp,"\"%p\";\n", (void *)
                                 ((mask & (ptrint) scan) / sizeof(DdNode)));
                if (retval == EOF) goto failure;
            }
            scan = scan->next;
        }
    }
    retval = fprintf(fp,"}\n}\n");
    if (retval == EOF) goto failure;

    /* Write edge info. */
    /* Edges from the output nodes. */
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp,"\"F%d\"", i);
        } else {
            retval = fprintf(fp,"\"  %s  \"", onames[i]);
        }
        if (retval == EOF) goto failure;
        retval = fprintf(fp," -> \"%p\" [style = solid];\n",
                         (void *) ((mask & (ptrint) f[i]) /
                                          sizeof(DdNode)));
        if (retval == EOF) goto failure;
    }

    /* Edges from internal nodes. */
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invpermZ[i]]) {
            nodelist = dd->subtableZ[i].nodelist;
            slots = dd->subtableZ[i].slots;
            for (j = 0; j < slots; j++) {
                scan = nodelist[j];
                while (scan != NULL) {
                    if ( st__is_member(visited,(char *) scan)) {
                        retval = fprintf(fp,
                            "\"%p\" -> \"%p\";\n",
                            (void *) ((mask & (ptrint) scan) / sizeof(DdNode)),
                            (void *) ((mask & (ptrint) cuddT(scan)) /
                                      sizeof(DdNode)));
                        if (retval == EOF) goto failure;
                        retval = fprintf(fp,
                                         "\"%p\" -> \"%p\" [style = dashed];\n",
                                         (void *) ((mask & (ptrint) scan)
                                                   / sizeof(DdNode)),
                                         (void *) ((mask & (ptrint)
                                                    cuddE(scan)) /
                                                   sizeof(DdNode)));
                        if (retval == EOF) goto failure;
                    }
                    scan = scan->next;
                }
            }
        }
    }

    /* Write constant labels. */
    nodelist = dd->constants.nodelist;
    slots = dd->constants.slots;
    for (j = 0; j < slots; j++) {
        scan = nodelist[j];
        while (scan != NULL) {
            if ( st__is_member(visited,(char *) scan)) {
                retval = fprintf(fp,"\"%p\" [label = \"%g\"];\n",
                                 (void *) ((mask & (ptrint) scan) /
                                           sizeof(DdNode)),
                                 cuddV(scan));
                if (retval == EOF) goto failure;
            }
            scan = scan->next;
        }
    }

    /* Write trailer and return. */
    retval = fprintf(fp,"}\n");
    if (retval == EOF) goto failure;

    st__free_table(visited);
    ABC_FREE(sorted);
    return(1);

failure:
    if (sorted != NULL) ABC_FREE(sorted);
    if (visited != NULL) st__free_table(visited);
    return(0);

}